

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XTemplateSerializer.cpp
# Opt level: O0

void xercesc_4_0::XTemplateSerializer::loadObject
               (NameIdPool<xercesc_4_0::DTDEntityDecl> **objToLoad,int initSize,int initSize2,
               XSerializeEngine *serEng)

{
  bool bVar1;
  MemoryManager *pMVar2;
  NameIdPool<xercesc_4_0::DTDEntityDecl> *this;
  XMLSize_t hashModulus;
  XMLSize_t initSize_00;
  DTDEntityDecl *this_00;
  DTDEntityDecl *data;
  uint local_30;
  uint itemIndex;
  uint itemNumber;
  XSerializeEngine *local_20;
  XSerializeEngine *serEng_local;
  int initSize2_local;
  int initSize_local;
  NameIdPool<xercesc_4_0::DTDEntityDecl> **objToLoad_local;
  
  local_20 = serEng;
  serEng_local._0_4_ = initSize2;
  serEng_local._4_4_ = initSize;
  _initSize2_local = objToLoad;
  bVar1 = XSerializeEngine::needToLoadObject(serEng,objToLoad);
  if (bVar1) {
    if (*_initSize2_local == (NameIdPool<xercesc_4_0::DTDEntityDecl> *)0x0) {
      if (serEng_local._4_4_ < 0) {
        serEng_local._4_4_ = 0x10;
      }
      pMVar2 = XSerializeEngine::getMemoryManager(local_20);
      this = (NameIdPool<xercesc_4_0::DTDEntityDecl> *)XMemory::operator_new(0x58,pMVar2);
      hashModulus = (XMLSize_t)serEng_local._4_4_;
      initSize_00 = (XMLSize_t)(int)serEng_local;
      pMVar2 = XSerializeEngine::getMemoryManager(local_20);
      NameIdPool<xercesc_4_0::DTDEntityDecl>::NameIdPool(this,hashModulus,initSize_00,pMVar2);
      *_initSize2_local = this;
    }
    XSerializeEngine::registerObject(local_20,*_initSize2_local);
    local_30 = 0;
    XSerializeEngine::operator>>(local_20,&local_30);
    for (data._4_4_ = 0; data._4_4_ < local_30; data._4_4_ = data._4_4_ + 1) {
      pMVar2 = XSerializeEngine::getMemoryManager(local_20);
      this_00 = (DTDEntityDecl *)XMemory::operator_new(0x60,pMVar2);
      pMVar2 = XSerializeEngine::getMemoryManager(local_20);
      DTDEntityDecl::DTDEntityDecl(this_00,pMVar2);
      (*(this_00->super_XMLEntityDecl).super_XSerializable._vptr_XSerializable[3])(this_00,local_20)
      ;
      NameIdPool<xercesc_4_0::DTDEntityDecl>::put(*_initSize2_local,this_00);
    }
  }
  return;
}

Assistant:

void XTemplateSerializer::loadObject(NameIdPool<DTDEntityDecl>** objToLoad
                                   , int                          initSize
                                   , int                          initSize2
                                   , XSerializeEngine&            serEng)
{
    if (serEng.needToLoadObject((void**)objToLoad))
    {
        if (!*objToLoad)
        {
            if (initSize < 0)
                initSize = 16;

            *objToLoad = new (serEng.getMemoryManager())
                             NameIdPool<DTDEntityDecl>(
                                                       initSize
                                                     , initSize2
                                                     , serEng.getMemoryManager()
                                                     );
        }

        serEng.registerObject(*objToLoad);

        unsigned int itemNumber = 0;
        serEng >> itemNumber;

        for (unsigned int itemIndex = 0; itemIndex < itemNumber; itemIndex++)
        {
            DTDEntityDecl*  data = new (serEng.getMemoryManager())
                                   DTDEntityDecl(serEng.getMemoryManager());
            data->serialize(serEng);
            (*objToLoad)->put(data);
        }
    }
}